

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setDualRowBounds(SPxSolverBase<double> *this)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  Status stat;
  SPxBasisBase<double> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  Status in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  Status in_stack_ffffffffffffffd4;
  int i_00;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    i_00 = local_c;
    iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2800cd);
    if (iVar1 <= i_00) break;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    *pdVar3 = 0.0;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    *pdVar3 = 0.0;
    in_stack_ffffffffffffffd4 = SPxBasisBase<double>::dualRowStatus(in_RDI,i_00);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    clearDualBounds((SPxSolverBase<double> *)
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (Status)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                    (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_c = local_c + 1;
  }
  local_c = 0;
  while( true ) {
    iVar1 = local_c;
    iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x28019b);
    if (iVar2 <= iVar1) break;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    *pdVar3 = 0.0;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    *pdVar3 = 0.0;
    in_stack_ffffffffffffffc4 = SPxBasisBase<double>::dualColStatus(in_RDI,i_00);
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    stat = (Status)((ulong)pdVar3 >> 0x20);
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    clearDualBounds((SPxSolverBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),stat,
                    (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setDualRowBounds()
{

   assert(rep() == ROW);

   int i;

   for(i = 0; i < this->nRows(); ++i)
   {
      theURbound[i] = 0.0;
      theLRbound[i] = 0.0;

      clearDualBounds(this->dualRowStatus(i), theURbound[i], theLRbound[i]);
   }

   for(i = 0; i < this->nCols(); ++i)
   {
      theUCbound[i] = 0.0;
      theLCbound[i] = 0.0;

      clearDualBounds(this->dualColStatus(i), theUCbound[i], theLCbound[i]);
   }
}